

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

int Abc_NtkAigToBdd(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  uint numVars;
  int iVar3;
  DdManager *ddDestination;
  DdManager *unique;
  Vec_Int_t *p;
  int *piVar4;
  DdNode *pDVar5;
  Vec_Ptr_t *pVVar6;
  DdNode *n;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  Hop_Obj_t *pObj;
  ulong uVar12;
  
  if (pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x28a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
  }
  numVars = Abc_NtkGetFaninMax(pNtk);
  if (numVars == 0) {
    puts("Warning: The network has only constant nodes.");
  }
  piVar4 = (int *)0x0;
  ddDestination = Cudd_Init(numVars,0,0x100,0x40000,0);
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  p = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < numVars - 1) {
    uVar8 = numVars;
  }
  p->nSize = 0;
  p->nCap = uVar8;
  if (uVar8 != 0) {
    piVar4 = (int *)malloc((long)(int)uVar8 << 2);
  }
  p->pArray = piVar4;
  plVar2 = (long *)pNtk->pManFunc;
  if ((int)plVar2[10] < (int)numVars) {
    __assert_fail("Hop_ManPiNum(pMan) >= nFaninsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x29a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
  }
  uVar12 = (ulong)numVars;
  if (0 < (int)numVars) {
    uVar11 = 0;
    do {
      pDVar5 = Cudd_bddIthVar(unique,(int)uVar11);
      lVar10 = *plVar2;
      if ((long)*(int *)(lVar10 + 4) <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      **(undefined8 **)(*(long *)(lVar10 + 8) + uVar11 * 8) = pDVar5;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pVVar6->pArray[lVar10];
      if (((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
         ((*(int *)(*plVar2 + 4) != 4 || ((*(int *)((long)plVar2 + 0x1c) != 1 || (plVar2[7] != 0))))
         )) {
        pObj = (Hop_Obj_t *)(plVar2[7] & 0xfffffffffffffffe);
        uVar8 = (uint)plVar2[7];
        if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
          pDVar5 = Cudd_ReadOne(unique);
          pDVar5 = (DdNode *)((ulong)(uVar8 & 1) ^ (ulong)pDVar5);
        }
        else {
          Abc_ConvertAigToBdd_rec1(unique,pObj);
          pDVar5 = (DdNode *)((ulong)(uVar8 & 1) ^ (ulong)(pObj->field_0).pData);
          Cudd_Ref(pDVar5);
          Abc_ConvertAigToBdd_rec2(unique,pObj);
          Cudd_Deref(pDVar5);
        }
        if (pDVar5 == (DdNode *)0x0) {
          puts("Abc_NtkAigToBdd: Error while converting AIG into BDD.");
          return 0;
        }
        Cudd_Ref(pDVar5);
        uVar8 = *(uint *)((long)plVar2 + 0x1c);
        if (p->nCap < (int)uVar8) {
          if (p->pArray == (int *)0x0) {
            piVar4 = (int *)malloc((long)(int)uVar8 << 2);
          }
          else {
            piVar4 = (int *)realloc(p->pArray,(long)(int)uVar8 << 2);
          }
          p->pArray = piVar4;
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          p->nCap = uVar8;
        }
        if (0 < (int)uVar8) {
          memset(p->pArray,0xff,(ulong)uVar8 * 4);
        }
        if ((int)numVars < 1) {
          iVar3 = 0;
        }
        else {
          piVar4 = unique->invperm;
          uVar11 = 0;
          iVar3 = 0;
          do {
            uVar1 = piVar4[uVar11];
            if ((int)uVar1 < *(int *)((long)plVar2 + 0x1c)) {
              if (((int)uVar1 < 0) || ((int)uVar8 <= (int)uVar1)) goto LAB_0084f891;
              p->pArray[uVar1] = iVar3;
              iVar3 = iVar3 + 1;
            }
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        if (iVar3 != *(int *)((long)plVar2 + 0x1c)) {
          __assert_fail("iVar == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                        ,0x2af,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
        }
        n = Extra_TransferPermute(unique,ddDestination,pDVar5,p->pArray);
        plVar2[7] = (long)n;
        Cudd_Ref(n);
        Cudd_RecursiveDeref(unique,pDVar5);
        p->nSize = 0;
        if (0 < (int)numVars) {
          uVar11 = 0;
          do {
            uVar8 = unique->invperm[uVar11];
            if ((int)uVar8 < *(int *)((long)plVar2 + 0x1c)) {
              if ((int)uVar8 < 0) goto LAB_0084f8b0;
              Vec_IntPush(p,*(int *)(plVar2[4] + (ulong)uVar8 * 4));
            }
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        uVar11 = (ulong)*(uint *)((long)plVar2 + 0x1c);
        if (0 < (int)*(uint *)((long)plVar2 + 0x1c)) {
          uVar7 = (ulong)(uint)p->nSize;
          if (p->nSize < 1) {
            uVar7 = 0;
          }
          uVar9 = 0;
          do {
            if (uVar7 == uVar9) {
LAB_0084f8b0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((long)(int)uVar11 <= (long)uVar9) {
LAB_0084f891:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)(plVar2[4] + uVar9 * 4) = p->pArray[uVar9];
            uVar9 = uVar9 + 1;
            uVar11 = (ulong)*(int *)((long)plVar2 + 0x1c);
          } while ((long)uVar9 < (long)uVar11);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar10 < pVVar6->nSize);
  }
  Extra_StopManager(unique);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
  pNtk->pManFunc = ddDestination;
  pNtk->ntkFunc = ABC_FUNC_BDD;
  return 1;
}

Assistant:

int Abc_NtkAigToBdd( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    DdNode * pFunc;
    DdManager * dd, * ddTemp = NULL;
    Vec_Int_t * vFanins = NULL;
    int nFaninsMax, i, k, iVar;

    assert( Abc_NtkHasAig(pNtk) ); 

    // start the functionality manager
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );

    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // start temporary manager for reordered local functions
    ddTemp = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( ddTemp,  CUDD_REORDER_SYMM_SIFT );
    vFanins = Vec_IntAlloc( nFaninsMax );

    // set the mapping of elementary AIG nodes into the elementary BDD nodes
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    assert( Hop_ManPiNum(pMan) >= nFaninsMax ); 
    for ( i = 0; i < nFaninsMax; i++ )
        Hop_ManPi(pMan, i)->pData = Cudd_bddIthVar(ddTemp, i);

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        pFunc = Abc_ConvertAigToBdd( ddTemp, (Hop_Obj_t *)pNode->pData );
        if ( pFunc == NULL )
        {
            printf( "Abc_NtkAigToBdd: Error while converting AIG into BDD.\n" );
            return 0;
        }
        Cudd_Ref( pFunc );
        // find variable mapping
        Vec_IntFill( vFanins, Abc_ObjFaninNum(pNode), -1 );
        for ( k = iVar = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntWriteEntry( vFanins, ddTemp->invperm[k], iVar++ );
        assert( iVar == Abc_ObjFaninNum(pNode) );
        // transfer to the main manager
        pNode->pData = Extra_TransferPermute( ddTemp, dd, pFunc, Vec_IntArray(vFanins) );
        Cudd_Ref( (DdNode *)pNode->pData );
        Cudd_RecursiveDeref( ddTemp, pFunc );
        // update variable order
        Vec_IntClear( vFanins );
        for ( k = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntPush( vFanins, Vec_IntEntry(&pNode->vFanins, ddTemp->invperm[k]) );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
            Vec_IntWriteEntry( &pNode->vFanins, k, Vec_IntEntry(vFanins, k) );
    }

//    printf( "Reorderings performed = %d.\n", Cudd_ReadReorderings(ddTemp) );
    Extra_StopManager( ddTemp );
    Vec_IntFreeP( &vFanins );
    Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
    pNtk->pManFunc = dd;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_BDD;
    return 1;
}